

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  float y_local;
  float x_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO == this) {
    if ((this->AppAcceptingEvents & 1U) != 0) {
      ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
      local_38._0_4_ = ImGuiInputEventType_MousePos;
      local_38._4_4_ = ImGuiInputSource_Mouse;
      e.Type = (ImGuiInputEventType)x;
      e.Source = (ImGuiInputSource)y;
      ImVector<ImGuiInputEvent>::push_back
                ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x37d8),(ImGuiInputEvent *)local_38);
    }
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x54d,"void ImGuiIO::AddMousePosEvent(float, float)");
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = x;
    e.MousePos.PosY = y;
    g.InputEventsQueue.push_back(e);
}